

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall
camp::NotEnoughArguments::NotEnoughArguments(NotEnoughArguments *this,NotEnoughArguments *param_1)

{
  NotEnoughArguments *param_1_local;
  NotEnoughArguments *this_local;
  
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__NotEnoughArguments_001fd538;
  return;
}

Assistant:

class CAMP_API NotEnoughArguments : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param functionName Name of the function
     * \param provided Number of arguments provided
     * \param expected Number of arguments expected
     */
    NotEnoughArguments(const std::string& functionName, std::size_t provided, std::size_t expected);
}